

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::section_impl
          (section_impl<ELFIO::Elf64_Shdr> *this,endianness_convertor *convertor,
          address_translator *translator,shared_ptr<ELFIO::compression_interface> *compression)

{
  shared_ptr<ELFIO::compression_interface> *compression_local;
  address_translator *translator_local;
  endianness_convertor *convertor_local;
  section_impl<ELFIO::Elf64_Shdr> *this_local;
  
  section::section(&this->super_section);
  (this->super_section)._vptr_section = (_func_int **)&PTR__section_impl_0011c658;
  this->pstream = (istream *)0x0;
  (this->header).sh_name = 0;
  (this->header).sh_type = 0;
  (this->header).sh_flags = 0;
  (this->header).sh_addr = 0;
  (this->header).sh_offset = 0;
  (this->header).sh_size = 0;
  (this->header).sh_link = 0;
  (this->header).sh_info = 0;
  (this->header).sh_addralign = 0;
  (this->header).sh_entsize = 0;
  this->index = 0;
  std::__cxx11::string::string((string *)&this->name);
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data);
  this->data_size = 0;
  this->convertor = convertor;
  this->translator = translator;
  std::shared_ptr<ELFIO::compression_interface>::shared_ptr(&this->compression,compression);
  this->is_address_set = false;
  this->stream_size = 0;
  this->is_lazy = false;
  this->is_loaded = false;
  this->can_be_loaded = true;
  return;
}

Assistant:

section_impl( const endianness_convertor*                   convertor,
                  const address_translator*                     translator,
                  const std::shared_ptr<compression_interface>& compression )
        : convertor( convertor ), translator( translator ),
          compression( compression )
    {
    }